

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::strconv_escape(char_t *s,gap *g)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  size_t count;
  uint ch;
  char *pcVar5;
  value_type local_18;
  
  local_18 = (value_type)(s + 1);
  bVar1 = s[1];
  if (0x66 < bVar1) {
    if (bVar1 == 0x67) {
      if (s[2] != 't') goto LAB_0018dc07;
      if (s[3] != ';') goto LAB_0018dc5c;
      *s = '>';
    }
    else {
      if (bVar1 != 0x6c) {
        if (bVar1 != 0x71) {
          return (char_t *)local_18;
        }
        if (s[2] != 'u') {
LAB_0018dc07:
          return s + 2;
        }
        if (s[3] != 'o') goto LAB_0018dc5c;
        if (s[4] != 't') goto LAB_0018dc90;
        if (s[5] != ';') goto LAB_0018dcd1;
        *s = '\"';
        goto LAB_0018dc51;
      }
      if (s[2] != 't') goto LAB_0018dc07;
      if (s[3] != ';') goto LAB_0018dc5c;
      *s = '<';
    }
    pcVar5 = s + 4;
    count = 3;
    goto LAB_0018dd30;
  }
  if (bVar1 != 0x23) {
    if (bVar1 != 0x61) {
      return (char_t *)local_18;
    }
    if (s[2] != 'p') {
      if (s[2] != 'm') goto LAB_0018dc07;
      if (s[3] != 'p') goto LAB_0018dc5c;
      if (s[4] != ';') goto LAB_0018dc90;
      *s = '&';
      pcVar5 = s + 5;
      count = 4;
      goto LAB_0018dd30;
    }
    if (s[3] != 'o') {
LAB_0018dc5c:
      return s + 3;
    }
    if (s[4] != 's') {
LAB_0018dc90:
      return s + 4;
    }
    if (s[5] != ';') {
LAB_0018dcd1:
      return s + 5;
    }
    *s = '\'';
LAB_0018dc51:
    pcVar5 = s + 6;
    count = 5;
    goto LAB_0018dd30;
  }
  pcVar5 = s + 2;
  cVar3 = s[2];
  if (cVar3 != ';') {
    if (cVar3 != 'x') {
      uVar4 = (int)cVar3 - 0x30;
      ch = 0;
      if (uVar4 < 10) {
        ch = 0;
        do {
          ch = uVar4 + ch * 10;
          cVar3 = pcVar5[1];
          pcVar5 = pcVar5 + 1;
          uVar4 = (int)cVar3 - 0x30;
        } while (uVar4 < 10);
      }
      if (cVar3 == ';') {
        pcVar5 = pcVar5 + 1;
        goto LAB_0018dccd;
      }
      goto LAB_0018dcdd;
    }
    cVar3 = s[3];
    if (cVar3 != ';') {
      pcVar5 = s + 4;
      ch = 0;
      do {
        uVar4 = (int)cVar3 - 0x30;
        if (uVar4 < 10) {
          ch = ch << 4 | uVar4;
        }
        else {
          uVar4 = (int)cVar3 | 0x20;
          if (5 < uVar4 - 0x61) goto LAB_0018dcc9;
          ch = (ch * 0x10 + uVar4) - 0x57;
        }
        cVar3 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      } while( true );
    }
    pcVar5 = s + 3;
  }
  ch = 0;
LAB_0018dcdd:
  bVar2 = false;
  goto LAB_0018dcdf;
LAB_0018dcc9:
  if (cVar3 != ';') {
    pcVar5 = pcVar5 + -1;
    goto LAB_0018dcdd;
  }
LAB_0018dccd:
  bVar2 = true;
LAB_0018dcdf:
  if (!bVar2) {
    return pcVar5;
  }
  if (ch < 0x10000) {
    local_18 = (value_type)s;
    local_18 = utf8_writer::low((value_type)s,ch);
  }
  else {
    *s = (byte)(ch >> 0x12) | 0xf0;
    s[1] = (byte)(ch >> 0xc) & 0x3f | 0x80;
    s[2] = (byte)(ch >> 6) & 0x3f | 0x80;
    s[3] = (byte)ch & 0x3f | 0x80;
    local_18 = (value_type)(s + 4);
  }
  count = (long)pcVar5 - (long)local_18;
LAB_0018dd30:
  gap::push(g,(char_t **)&local_18,count);
  return pcVar5;
}

Assistant:

PUGI__FN char_t* strconv_escape(char_t* s, gap& g)
	{
		char_t* stre = s + 1;

		switch (*stre)
		{
			case '#':	// &#...
			{
				unsigned int ucsc = 0;

				if (stre[1] == 'x') // &#x... (hex code)
				{
					stre += 2;

					char_t ch = *stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 16 * ucsc + (ch - '0');
						else if (static_cast<unsigned int>((ch | ' ') - 'a') <= 5)
							ucsc = 16 * ucsc + ((ch | ' ') - 'a' + 10);
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}
				else	// &#... (dec code)
				{
					char_t ch = *++stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 10 * ucsc + (ch - '0');
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}

			#ifdef PUGIXML_WCHAR_MODE
				s = reinterpret_cast<char_t*>(wchar_writer::any(reinterpret_cast<wchar_writer::value_type>(s), ucsc));
			#else
				s = reinterpret_cast<char_t*>(utf8_writer::any(reinterpret_cast<uint8_t*>(s), ucsc));
			#endif

				g.push(s, stre - s);
				return stre;
			}

			case 'a':	// &a
			{
				++stre;

				if (*stre == 'm') // &am
				{
					if (*++stre == 'p' && *++stre == ';') // &amp;
					{
						*s++ = '&';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				else if (*stre == 'p') // &ap
				{
					if (*++stre == 'o' && *++stre == 's' && *++stre == ';') // &apos;
					{
						*s++ = '\'';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				break;
			}

			case 'g': // &g
			{
				if (*++stre == 't' && *++stre == ';') // &gt;
				{
					*s++ = '>';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'l': // &l
			{
				if (*++stre == 't' && *++stre == ';') // &lt;
				{
					*s++ = '<';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'q': // &q
			{
				if (*++stre == 'u' && *++stre == 'o' && *++stre == 't' && *++stre == ';') // &quot;
				{
					*s++ = '"';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			default:
				break;
		}

		return stre;
	}